

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexVerifierUtil.cpp
# Opt level: O3

void tcu::TexVerifierUtil::getPossibleCubeFaces
               (Vec3 *coord,IVec3 *bits,CubeFace *faces,int *numFaces)

{
  float fVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  float fVar8;
  CubeFace CVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  deUint32 u32;
  float fVar13;
  float fVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  
  fVar1 = coord->m_data[2];
  fVar10 = -fVar1;
  if (-fVar1 <= fVar1) {
    fVar10 = fVar1;
  }
  uVar2 = *(ulong *)coord->m_data;
  fVar11 = (float)uVar2;
  fVar12 = (float)(uVar2 >> 0x20);
  auVar14._0_8_ = uVar2 ^ 0x8000000080000000;
  auVar14._8_4_ = 0x80000000;
  auVar14._12_4_ = 0x80000000;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar2;
  auVar15 = maxps(auVar14,auVar15);
  fVar13 = auVar15._0_4_;
  fVar16 = auVar15._4_4_;
  uVar6 = ~-(uint)((uVar2 & 0x7fffff) == 0) & -(uint)((uVar2 & 0x7f800000) == 0);
  uVar4 = ~-(uint)((uVar2 & 0x7fffff00000000) == 0) & -(uint)((uVar2 & 0x7f80000000000000) == 0);
  fVar17 = (float)(uVar6 & 0x800000 | ~uVar6 & (uint)fVar11 & 0x7f800000);
  fVar18 = (float)(uVar4 & 0x800000 | ~uVar4 & (uint)fVar12 & 0x7f800000);
  fVar17 = (float)((-(int)(float)((0x17 - (int)*(undefined8 *)bits->m_data) * 0x800000 + 0x3f800000)
                    & 0x7fffffU | (uint)fVar17) ^ 0x7fffff) - fVar17;
  fVar18 = (float)((-(int)(float)((0x17 - (int)((ulong)*(undefined8 *)bits->m_data >> 0x20)) *
                                  0x800000 + 0x3f800000) & 0x7fffffU | (uint)fVar18) ^ 0x7fffff) -
           fVar18;
  bVar3 = 0x17 - (char)bits->m_data[2];
  fVar8 = (float)((uint)fVar1 & 0x7f800000);
  fVar19 = 1.1754944e-38;
  if (((uint)fVar1 & 0x7fffff) == 0) {
    fVar19 = fVar8;
  }
  if (fVar8 != 0.0) {
    fVar19 = fVar8;
  }
  fVar19 = (float)(((0x7fffffU >> (bVar3 & 0x1f)) << (bVar3 & 0x1f) | (uint)fVar19) ^ 0x7fffff) -
           fVar19;
  *numFaces = 0;
  if ((fVar13 - fVar17 <= fVar16 + fVar18) || (fVar13 - fVar17 <= fVar10 + fVar19)) {
    if ((fVar16 - fVar18 <= fVar17 + fVar13) || (fVar16 - fVar18 <= fVar10 + fVar19)) {
      if ((fVar10 - fVar19 <= fVar17 + fVar13) || (fVar10 - fVar19 <= fVar16 + fVar18)) {
        lVar7 = 0;
        if (fVar17 < fVar13) {
          *faces = CUBEFACE_NEGATIVE_X;
          *numFaces = 2;
          faces[1] = CUBEFACE_POSITIVE_X;
          lVar7 = 2;
        }
        uVar6 = (uint)lVar7;
        if (fVar18 < fVar16) {
          faces[lVar7] = CUBEFACE_NEGATIVE_Y;
          uVar6 = uVar6 + 2;
          *numFaces = uVar6;
          faces[lVar7 + 1] = CUBEFACE_POSITIVE_Y;
        }
        if (fVar10 <= fVar19) {
          return;
        }
        uVar4 = uVar6 + 1;
        faces[uVar6] = CUBEFACE_NEGATIVE_Z;
        iVar5 = uVar6 + 2;
        CVar9 = CUBEFACE_POSITIVE_Z;
      }
      else {
        if (fVar19 <= fVar1) {
          *numFaces = 1;
          *faces = CUBEFACE_POSITIVE_Z;
        }
        uVar4 = (uint)(fVar19 <= fVar1);
        if (fVar19 < fVar1) {
          return;
        }
        iVar5 = uVar4 + 1;
        CVar9 = CUBEFACE_NEGATIVE_Z;
      }
    }
    else {
      if (fVar18 <= fVar12) {
        *numFaces = 1;
        *faces = CUBEFACE_POSITIVE_Y;
      }
      uVar4 = (uint)(fVar18 <= fVar12);
      if (fVar18 < fVar12) {
        return;
      }
      iVar5 = uVar4 + 1;
      CVar9 = CUBEFACE_NEGATIVE_Y;
    }
  }
  else {
    if (fVar17 <= fVar11) {
      *numFaces = 1;
      *faces = CUBEFACE_POSITIVE_X;
    }
    uVar4 = (uint)(fVar17 <= fVar11);
    if (fVar17 < fVar11) {
      return;
    }
    iVar5 = uVar4 + 1;
    CVar9 = CUBEFACE_NEGATIVE_X;
  }
  *numFaces = iVar5;
  faces[uVar4] = CVar9;
  return;
}

Assistant:

void getPossibleCubeFaces (const Vec3& coord, const IVec3& bits, CubeFace* faces, int& numFaces)
{
	const float	x	= coord.x();
	const float	y	= coord.y();
	const float	z	= coord.z();
	const float ax	= de::abs(x);
	const float ay	= de::abs(y);
	const float az	= de::abs(z);
	const float ex	= computeFloatingPointError(x, bits.x());
	const float	ey	= computeFloatingPointError(y, bits.y());
	const float ez	= computeFloatingPointError(z, bits.z());

	numFaces = 0;

	if (ay+ey < ax-ex && az+ez < ax-ex)
	{
		if (x >= ex) faces[numFaces++] = CUBEFACE_POSITIVE_X;
		if (x <= ex) faces[numFaces++] = CUBEFACE_NEGATIVE_X;
	}
	else if (ax+ex < ay-ey && az+ez < ay-ey)
	{
		if (y >= ey) faces[numFaces++] = CUBEFACE_POSITIVE_Y;
		if (y <= ey) faces[numFaces++] = CUBEFACE_NEGATIVE_Y;
	}
	else if (ax+ex < az-ez && ay+ey < az-ez)
	{
		if (z >= ez) faces[numFaces++] = CUBEFACE_POSITIVE_Z;
		if (z <= ez) faces[numFaces++] = CUBEFACE_NEGATIVE_Z;
	}
	else
	{
		// One or more components are equal (or within error bounds). Allow all faces where major axis is not zero.
		if (ax > ex)
		{
			faces[numFaces++] = CUBEFACE_NEGATIVE_X;
			faces[numFaces++] = CUBEFACE_POSITIVE_X;
		}

		if (ay > ey)
		{
			faces[numFaces++] = CUBEFACE_NEGATIVE_Y;
			faces[numFaces++] = CUBEFACE_POSITIVE_Y;
		}

		if (az > ez)
		{
			faces[numFaces++] = CUBEFACE_NEGATIVE_Z;
			faces[numFaces++] = CUBEFACE_POSITIVE_Z;
		}
	}
}